

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse_Args.cpp
# Opt level: O1

int Nova::Parse_Args::Find_And_Remove_Integer(char *str,int *argc,char **argv)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  char **ppcVar4;
  int iVar5;
  ulong uVar6;
  
  uVar1 = *argc;
  uVar6 = 0;
  if (0 < (long)(int)uVar1) {
    uVar6 = 0;
    do {
      iVar2 = strcmp(str,argv[uVar6]);
      if (iVar2 == 0) goto LAB_0012507d;
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
    uVar6 = (ulong)uVar1;
  }
LAB_0012507d:
  iVar2 = 0;
  uVar3 = (int)uVar6 + 1;
  if ((int)uVar3 < (int)uVar1) {
    iVar2 = atoi(argv[uVar3]);
    iVar5 = uVar1 - 2;
    if ((int)uVar6 < iVar5) {
      ppcVar4 = argv + (uVar6 & 0xffffffff) + 2;
      do {
        ppcVar4[-2] = *ppcVar4;
        ppcVar4 = ppcVar4 + 1;
        uVar3 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar3;
      } while ((int)uVar3 < iVar5);
    }
    *argc = uVar1 - 1;
    argv[(long)(int)uVar1 + -1] = (char *)0x0;
    *argc = iVar5;
    argv[iVar5] = (char *)0x0;
  }
  return iVar2;
}

Assistant:

int Parse_Args::
Find_And_Remove_Integer(const char *str,int& argc,char** argv)
{
    int value,i;
    for(i=0;i<argc;i++) if(!strcmp(str,argv[i])) break;
    if(i+1<argc)
    {
        value=atoi(argv[i+1]);
        for(;i<argc-2;i++) argv[i]=argv[i+2];
        argc--;
        argv[argc]=0;
        argc--;
        argv[argc]=0;
        return value;
    }
    return 0;
}